

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# crc.cc
# Opt level: O1

void absl::lts_20240722::crc_internal::CRC32::ExtendByZeroesImpl
               (uint32_t *crc,size_t length,uint32_t *zeroes_table,uint32_t *poly_table)

{
  int i;
  int iVar1;
  uint32_t uVar2;
  uint uVar3;
  ulong uVar4;
  bool bVar5;
  ulong local_38 [3];
  uint64_t mtab [4];
  
  if (length != 0) {
    uVar2 = *crc;
    iVar1 = 0;
    do {
      if ((length & 0xf) != 0) {
        local_38[1] = (ulong)zeroes_table[(ulong)(((uint)length & 0xf) + iVar1) - 1] * 2;
        local_38[2] = (ulong)zeroes_table[(ulong)(((uint)length & 0xf) + iVar1) - 1] << 2;
        local_38[0] = 0;
        mtab[0] = local_38[2] ^ local_38[1];
        uVar3 = 0xfffffff8;
        uVar4 = 0;
        do {
          uVar4 = uVar4 ^ local_38[uVar2 & 3] ^
                  *(long *)((long)local_38 + (ulong)(uVar2 & 0xc) * 2) << 2 ^
                  *(long *)((long)local_38 + (ulong)(uVar2 >> 1 & 0x18)) << 4 ^
                  *(long *)((long)local_38 + (ulong)(uVar2 >> 3 & 0x18)) << 6;
          uVar2 = uVar2 >> 8;
          uVar4 = (ulong)poly_table[uVar4 & 0xff] ^ uVar4 >> 8;
          uVar3 = uVar3 + 8;
        } while (uVar3 < 0x18);
        uVar2 = (uint32_t)uVar4;
      }
      iVar1 = iVar1 + 0xf;
      bVar5 = 0xf < length;
      length = length >> 4;
    } while (bVar5);
    *crc = uVar2;
  }
  return;
}

Assistant:

void CRC32::ExtendByZeroesImpl(uint32_t* crc, size_t length,
                               const uint32_t zeroes_table[256],
                               const uint32_t poly_table[256]) {
  if (length != 0) {
    uint32_t l = *crc;
    // For each ZEROES_BASE_LG bits in length
    // (after the low-order bits have been removed)
    // we lookup the appropriate polynomial in the zeroes_ array
    // and do a polynomial long multiplication (mod the CRC polynomial)
    // to extend the CRC by the appropriate number of bits.
    for (int i = 0; length != 0;
         i += ZEROES_BASE - 1, length >>= ZEROES_BASE_LG) {
      int c = length & (ZEROES_BASE - 1);  // pick next ZEROES_BASE_LG bits
      if (c != 0) {                        // if they are not zero,
                                           // multiply by entry in table
        // Build a table to aid in multiplying 2 bits at a time.
        // It takes too long to build tables for more bits.
        uint64_t m = zeroes_table[c + i - 1];
        m <<= 1;
        uint64_t m2 = m << 1;
        uint64_t mtab[4] = {0, m, m2, m2 ^ m};

        // Do the multiply one byte at a time.
        uint64_t result = 0;
        for (int x = 0; x < 32; x += 8) {
          // The carry-less multiply.
          result ^= mtab[l & 3] ^ (mtab[(l >> 2) & 3] << 2) ^
                    (mtab[(l >> 4) & 3] << 4) ^ (mtab[(l >> 6) & 3] << 6);
          l >>= 8;

          // Reduce modulo the polynomial
          result = (result >> 8) ^ poly_table[result & 0xff];
        }
        l = static_cast<uint32_t>(result);
      }
    }
    *crc = l;
  }
}